

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void C_ArchiveAliases(FConfigFile *f)

{
  FConsoleAlias *this;
  int iVar1;
  FConsoleCommand **ppFVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0xfb; lVar3 = lVar3 + 1) {
    ppFVar2 = Commands + lVar3;
    while (this = (FConsoleAlias *)*ppFVar2, this != (FConsoleAlias *)0x0) {
      iVar1 = (*(this->super_FConsoleCommand)._vptr_FConsoleCommand[2])(this);
      if ((char)iVar1 != '\0') {
        FConsoleAlias::Archive(this,f);
      }
      ppFVar2 = &(this->super_FConsoleCommand).m_Next;
    }
  }
  return;
}

Assistant:

void C_ArchiveAliases (FConfigFile *f)
{
	int bucket;
	FConsoleCommand *alias;

	for (bucket = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		alias = Commands[bucket];
		while (alias)
		{
			if (alias->IsAlias())
				static_cast<FConsoleAlias *>(alias)->Archive (f);
			alias = alias->m_Next;
		}
	}
}